

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O3

Status __thiscall leveldb::log::Writer::AddRecord(Writer *this,Slice *slice)

{
  uint uVar1;
  int iVar2;
  WritableFile *pWVar3;
  size_t *in_RDX;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  size_t n;
  Status *s;
  WritableFile *local_48;
  ulong local_40;
  void *local_38;
  
  n = *in_RDX;
  uVar6 = in_RDX[1];
  bVar7 = true;
  do {
    iVar2 = (int)slice->size_;
    if (0x8000 < iVar2) {
      this->dest_ = (WritableFile *)0x0;
      __assert_fail("leftover >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/log_writer.cc"
                    ,0x2f,"Status leveldb::log::Writer::AddRecord(const Slice &)");
    }
    if (0x7ff9 < iVar2) {
      if (iVar2 != 0x8000) {
        local_40 = (ulong)(0x8000 - iVar2);
        local_48 = (WritableFile *)0x1228a2;
        (**(code **)(*(long *)slice->data_ + 0x10))(&local_38,slice->data_,&local_48);
        if (local_38 != (void *)0x0) {
          operator_delete__(local_38);
        }
      }
      *(undefined4 *)&slice->size_ = 0;
      iVar2 = 0;
    }
    if ((int)(0x7ff9U - iVar2) < 0) {
      this->dest_ = (WritableFile *)0x0;
      __assert_fail("kBlockSize - block_offset_ - kHeaderSize >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/log_writer.cc"
                    ,0x3b,"Status leveldb::log::Writer::AddRecord(const Slice &)");
    }
    uVar4 = (ulong)(0x7ff9U - iVar2);
    uVar5 = uVar4;
    if (uVar6 < uVar4) {
      uVar5 = uVar6;
    }
    uVar1 = (uVar4 < uVar6) + 1;
    if (!bVar7) {
      uVar1 = 4 - (uVar4 < uVar6);
    }
    EmitPhysicalRecord((Writer *)&local_48,(RecordType)slice,(char *)(ulong)uVar1,n);
    if (local_48 == (WritableFile *)0x0) {
      pWVar3 = (WritableFile *)0x0;
    }
    else {
      pWVar3 = (WritableFile *)Status::CopyState((char *)local_48);
      if (local_48 != (WritableFile *)0x0) {
        operator_delete__(local_48);
      }
    }
    if (pWVar3 != (WritableFile *)0x0) break;
    n = n + uVar5;
    bVar7 = false;
    uVar6 = uVar6 - uVar5;
  } while (uVar6 != 0);
  this->dest_ = pWVar3;
  return (Status)(char *)this;
}

Assistant:

Status Writer::AddRecord(const Slice &slice) {
            const char *ptr = slice.data();
            size_t left = slice.size();

            // Fragment the record if necessary and emit it.  Note that if slice
            // is empty, we still want to iterate once to emit a single
            // zero-length record
            Status s;
            bool begin = true;
            do {
                const int leftover = kBlockSize - block_offset_;
                assert(leftover >= 0);
                if (leftover < kHeaderSize) {
                    // Switch to a new block
                    if (leftover > 0) {
                        // Fill the trailer (literal below relies on kHeaderSize being 7)
                        assert(kHeaderSize == 7);
                        dest_->Append(Slice("\x00\x00\x00\x00\x00\x00", leftover));
                    }
                    block_offset_ = 0;
                }

                // Invariant: we never leave < kHeaderSize bytes in a block.
                assert(kBlockSize - block_offset_ - kHeaderSize >= 0);

                const size_t avail = kBlockSize - block_offset_ - kHeaderSize;
                const size_t fragment_length = (left < avail) ? left : avail;

                RecordType type;
                const bool end = (left == fragment_length);
                if (begin && end) {
                    type = kFullType;
                } else if (begin) {
                    type = kFirstType;
                } else if (end) {
                    type = kLastType;
                } else {
                    type = kMiddleType;
                }

                s = EmitPhysicalRecord(type, ptr, fragment_length);
                ptr += fragment_length;
                left -= fragment_length;
                begin = false;
            } while (s.ok() && left > 0);
            return s;
        }